

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *mtctx,size_t srcSize,ZSTD_EndDirective endOp)

{
  void *pvVar1;
  ZSTDMT_jobDescription *pZVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t local_58;
  bool local_49;
  ZSTD_CDict *local_48;
  size_t newPrefixSize;
  BYTE *src;
  int endFrame;
  uint jobID;
  ZSTD_EndDirective endOp_local;
  size_t srcSize_local;
  ZSTDMT_CCtx *mtctx_local;
  
  uVar3 = mtctx->nextJobID & mtctx->jobIDMask;
  uVar4 = (uint)(endOp == ZSTD_e_end);
  if (mtctx->doneJobID + mtctx->jobIDMask < mtctx->nextJobID) {
    if ((mtctx->nextJobID & mtctx->jobIDMask) != (mtctx->doneJobID & mtctx->jobIDMask)) {
      __assert_fail("(mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5099,
                    "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)");
    }
  }
  else {
    if (mtctx->jobReady == 0) {
      pvVar1 = (mtctx->inBuff).buffer.start;
      mtctx->jobs[uVar3].src.start = pvVar1;
      mtctx->jobs[uVar3].src.size = srcSize;
      if ((mtctx->inBuff).filled < srcSize) {
        __assert_fail("mtctx->inBuff.filled >= srcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x50a3,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
      pZVar2 = mtctx->jobs;
      pZVar2[uVar3].prefix.start = (mtctx->inBuff).prefix.start;
      pZVar2[uVar3].prefix.size = (mtctx->inBuff).prefix.size;
      mtctx->jobs[uVar3].consumed = 0;
      mtctx->jobs[uVar3].cSize = 0;
      memcpy(&mtctx->jobs[uVar3].params,&mtctx->params,0x90);
      if (mtctx->nextJobID == 0) {
        local_48 = mtctx->cdict;
      }
      else {
        local_48 = (ZSTD_CDict *)0x0;
      }
      mtctx->jobs[uVar3].cdict = local_48;
      mtctx->jobs[uVar3].fullFrameSize = mtctx->frameContentSize;
      pZVar2 = mtctx->jobs;
      pZVar2[uVar3].dstBuff.start = (void *)0x0;
      pZVar2[uVar3].dstBuff.capacity = 0;
      mtctx->jobs[uVar3].cctxPool = mtctx->cctxPool;
      mtctx->jobs[uVar3].bufPool = mtctx->bufPool;
      mtctx->jobs[uVar3].seqPool = mtctx->seqPool;
      mtctx->jobs[uVar3].serial = &mtctx->serial;
      mtctx->jobs[uVar3].jobID = mtctx->nextJobID;
      mtctx->jobs[uVar3].firstJob = (uint)(mtctx->nextJobID == 0);
      mtctx->jobs[uVar3].lastJob = uVar4;
      local_49 = false;
      if (((mtctx->params).fParams.checksumFlag != 0) && (local_49 = false, uVar4 != 0)) {
        local_49 = mtctx->nextJobID != 0;
      }
      mtctx->jobs[uVar3].frameChecksumNeeded = (uint)local_49;
      mtctx->jobs[uVar3].dstFlushed = 0;
      (mtctx->roundBuff).pos = srcSize + (mtctx->roundBuff).pos;
      (mtctx->inBuff).buffer.start = (void *)0x0;
      (mtctx->inBuff).buffer.capacity = 0;
      (mtctx->inBuff).filled = 0;
      if (uVar4 == 0) {
        local_58 = srcSize;
        if (mtctx->targetPrefixSize <= srcSize) {
          local_58 = mtctx->targetPrefixSize;
        }
        (mtctx->inBuff).prefix.start = (void *)((long)pvVar1 + (srcSize - local_58));
        (mtctx->inBuff).prefix.size = local_58;
      }
      else {
        (mtctx->inBuff).prefix.start = (void *)0x0;
        (mtctx->inBuff).prefix.size = 0;
        mtctx->frameEnded = uVar4;
        if (mtctx->nextJobID == 0) {
          (mtctx->params).fParams.checksumFlag = 0;
        }
      }
      if ((srcSize == 0) && (mtctx->nextJobID != 0)) {
        if (endOp == ZSTD_e_end) {
          ZSTDMT_writeLastEmptyBlock(mtctx->jobs + uVar3);
          mtctx->nextJobID = mtctx->nextJobID + 1;
          return 0;
        }
        __assert_fail("endOp == ZSTD_e_end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x50c9,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
    }
    iVar5 = POOL_tryAdd(mtctx->factory,ZSTDMT_compressionJob,mtctx->jobs + uVar3);
    if (iVar5 == 0) {
      mtctx->jobReady = 1;
    }
    else {
      mtctx->nextJobID = mtctx->nextJobID + 1;
      mtctx->jobReady = 0;
    }
  }
  return 0;
}

Assistant:

static size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx* mtctx, size_t srcSize, ZSTD_EndDirective endOp)
{
    unsigned const jobID = mtctx->nextJobID & mtctx->jobIDMask;
    int const endFrame = (endOp == ZSTD_e_end);

    if (mtctx->nextJobID > mtctx->doneJobID + mtctx->jobIDMask) {
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: will not create new job : table is full");
        assert((mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask));
        return 0;
    }

    if (!mtctx->jobReady) {
        BYTE const* src = (BYTE const*)mtctx->inBuff.buffer.start;
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: preparing job %u to compress %u bytes with %u preload ",
                    mtctx->nextJobID, (U32)srcSize, (U32)mtctx->inBuff.prefix.size);
        mtctx->jobs[jobID].src.start = src;
        mtctx->jobs[jobID].src.size = srcSize;
        assert(mtctx->inBuff.filled >= srcSize);
        mtctx->jobs[jobID].prefix = mtctx->inBuff.prefix;
        mtctx->jobs[jobID].consumed = 0;
        mtctx->jobs[jobID].cSize = 0;
        mtctx->jobs[jobID].params = mtctx->params;
        mtctx->jobs[jobID].cdict = mtctx->nextJobID==0 ? mtctx->cdict : NULL;
        mtctx->jobs[jobID].fullFrameSize = mtctx->frameContentSize;
        mtctx->jobs[jobID].dstBuff = g_nullBuffer;
        mtctx->jobs[jobID].cctxPool = mtctx->cctxPool;
        mtctx->jobs[jobID].bufPool = mtctx->bufPool;
        mtctx->jobs[jobID].seqPool = mtctx->seqPool;
        mtctx->jobs[jobID].serial = &mtctx->serial;
        mtctx->jobs[jobID].jobID = mtctx->nextJobID;
        mtctx->jobs[jobID].firstJob = (mtctx->nextJobID==0);
        mtctx->jobs[jobID].lastJob = endFrame;
        mtctx->jobs[jobID].frameChecksumNeeded = mtctx->params.fParams.checksumFlag && endFrame && (mtctx->nextJobID>0);
        mtctx->jobs[jobID].dstFlushed = 0;

        /* Update the round buffer pos and clear the input buffer to be reset */
        mtctx->roundBuff.pos += srcSize;
        mtctx->inBuff.buffer = g_nullBuffer;
        mtctx->inBuff.filled = 0;
        /* Set the prefix */
        if (!endFrame) {
            size_t const newPrefixSize = MIN(srcSize, mtctx->targetPrefixSize);
            mtctx->inBuff.prefix.start = src + srcSize - newPrefixSize;
            mtctx->inBuff.prefix.size = newPrefixSize;
        } else {   /* endFrame==1 => no need for another input buffer */
            mtctx->inBuff.prefix = kNullRange;
            mtctx->frameEnded = endFrame;
            if (mtctx->nextJobID == 0) {
                /* single job exception : checksum is already calculated directly within worker thread */
                mtctx->params.fParams.checksumFlag = 0;
        }   }

        if ( (srcSize == 0)
          && (mtctx->nextJobID>0)/*single job must also write frame header*/ ) {
            DEBUGLOG(5, "ZSTDMT_createCompressionJob: creating a last empty block to end frame");
            assert(endOp == ZSTD_e_end);  /* only possible case : need to end the frame with an empty last block */
            ZSTDMT_writeLastEmptyBlock(mtctx->jobs + jobID);
            mtctx->nextJobID++;
            return 0;
        }
    }

    DEBUGLOG(5, "ZSTDMT_createCompressionJob: posting job %u : %u bytes  (end:%u, jobNb == %u (mod:%u))",
                mtctx->nextJobID,
                (U32)mtctx->jobs[jobID].src.size,
                mtctx->jobs[jobID].lastJob,
                mtctx->nextJobID,
                jobID);
    if (POOL_tryAdd(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[jobID])) {
        mtctx->nextJobID++;
        mtctx->jobReady = 0;
    } else {
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: no worker available for job %u", mtctx->nextJobID);
        mtctx->jobReady = 1;
    }
    return 0;
}